

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_escape_sequence<std::vector<char,std::allocator<char>>>
          (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  byte bVar1;
  const_iterator rollback;
  value_type *pvVar2;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  location<std::vector<char,_std::allocator<char>_>_> *loc_01;
  location<std::vector<char,_std::allocator<char>_>_> *loc_02;
  char *__s;
  string *ctx;
  string *psVar3;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  allocator_type local_13a;
  allocator<char> local_139;
  string msg;
  allocator_type local_109;
  string local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  location<std::vector<char,_std::allocator<char>_>_> *local_80;
  string local_78;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  rollback._M_current = *(char **)(this + 0x40);
  if ((rollback._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*rollback._M_current != '\\')
     ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"[error]: toml::parse_escape_sequence: ",
               (allocator<char> *)&local_80);
    local_38.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::
    pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[38],_true>
              ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&token,(location<std::vector<char,_std::allocator<char>_>_> **)&local_38,
               (char (*) [38])"the next token is not a backslash \"\\\"");
    __l._M_len = 1;
    __l._M_array = (iterator)&token;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_78,__l,&local_13a);
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline(&local_108,&local_58,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_78,&local_e8);
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) {
      msg.field_2._8_8_ = local_108.field_2._8_8_;
    }
    else {
      msg._M_dataplus._M_p = local_108._M_dataplus._M_p;
    }
    msg.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
    msg._M_string_length = local_108._M_string_length;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity =
         local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,(failure_type *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::~string((string *)&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_78);
    std::__cxx11::string::~string((string *)&token.field_1.succ);
    psVar3 = &local_58;
    goto LAB_00118eee;
  }
  location<std::vector<char,_std::allocator<char>_>_>::advance
            ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
  bVar1 = **(byte **)(this + 0x40);
  loc_00 = (location<std::vector<char,_std::allocator<char>_>_> *)(ulong)(bVar1 - 0x6e);
  if (bVar1 - 0x6e < 8) {
    loc_01 = (location<std::vector<char,_std::allocator<char>_>_> *)
             ((long)&switchD_00118ca8::switchdataD_001330e0 +
             (long)(int)(&switchD_00118ca8::switchdataD_001330e0)[(long)loc_00]);
    switch(loc_00) {
    case (location<std::vector<char,_std::allocator<char>_>_> *)0x0:
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
      __s = "\n";
      break;
    default:
switchD_00118ca8_caseD_6f:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,
                 "[error] parse_escape_sequence: unknown escape sequence appeared.",
                 (allocator<char> *)&local_80);
      local_38.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[64],_true>
                ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&token,(location<std::vector<char,_std::allocator<char>_>_> **)&local_38,
                 (char (*) [64])"escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx")
      ;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&token;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_78,__l_00,&local_13a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 "if you want to write backslash as just one backslash, use literal string like: regex    = \'<\\i\\c*\\s*>\'"
                 ,&local_139);
      __l_01._M_len = 1;
      __l_01._M_array = &local_58;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e8,__l_01,&local_109);
      format_underline(&msg,&local_108,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_78,&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e8);
      std::__cxx11::string::~string((string *)&local_58);
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_78);
      std::__cxx11::string::~string((string *)&token.field_1.succ);
      std::__cxx11::string::~string((string *)&local_108);
      location<std::vector<char,_std::allocator<char>_>_>::reset
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
      std::__cxx11::string::string((string *)&token,(string *)&msg);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(failure_type *)&token);
      std::__cxx11::string::~string((string *)&token);
      psVar3 = &msg;
      goto LAB_00118eee;
    case (location<std::vector<char,_std::allocator<char>_>_> *)0x4:
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
      __s = "\r";
      break;
    case (location<std::vector<char,_std::allocator<char>_>_> *)0x6:
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
      __s = "\t";
      break;
    case (location<std::vector<char,_std::allocator<char>_>_> *)0x7:
      sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>
      ::invoke<std::vector<char,std::allocator<char>>>
                (&token,(sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>
                         *)this,loc_02);
      if (token.is_ok_ != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,
                   "[error] parse_escape_sequence: invalid token found in UTF-8 codepoint uXXXX.",
                   (allocator<char> *)&local_13a);
        local_80 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                  ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&msg,&local_80,(char (*) [5])0x135757);
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)&msg;
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_e8,__l_02,(allocator_type *)&local_139);
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_58,&local_78,
                         (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_e8,&local_38);
LAB_0011905a:
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) {
          local_108.field_2._8_8_ = local_58.field_2._8_8_;
        }
        else {
          local_108._M_dataplus._M_p = local_58._M_dataplus._M_p;
        }
        local_108.field_2._M_allocated_capacity._1_7_ = local_58.field_2._M_allocated_capacity._1_7_
        ;
        local_108.field_2._M_local_buf[0] = local_58.field_2._M_local_buf[0];
        local_108._M_string_length = local_58._M_string_length;
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        ctx = &local_108;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,(failure_type *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_58);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_38);
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_e8);
        std::__cxx11::string::~string((string *)&msg._M_string_length);
        psVar3 = &local_78;
        goto LAB_00119131;
      }
      pvVar2 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
               ::unwrap(&token);
      read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                (&local_108,(detail *)pvVar2,
                 (region<std::vector<char,_std::allocator<char>_>_> *)this,loc_01);
LAB_00118f37:
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        msg.field_2._8_8_ = local_108.field_2._8_8_;
      }
      else {
        msg._M_dataplus._M_p = local_108._M_dataplus._M_p;
      }
      psVar3 = &local_108;
      msg._M_string_length = local_108._M_string_length;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity =
           local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
      ctx = &msg;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,(success_type *)&msg);
      std::__cxx11::string::~string((string *)&msg);
LAB_00119131:
      std::__cxx11::string::~string((string *)psVar3);
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::cleanup(&token,(EVP_PKEY_CTX *)ctx);
      return __return_storage_ptr__;
    }
  }
  else if (bVar1 == 0x22) {
    location<std::vector<char,_std::allocator<char>_>_>::advance
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
    __s = "\"";
  }
  else {
    if (bVar1 == 0x55) {
      sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
      ::invoke<std::vector<char,std::allocator<char>>>
                (&token,(sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
                         *)this,loc_02);
      if (token.is_ok_ != true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,
                   "[error] parse_escape_sequence: invalid token found in UTF-8 codepoint Uxxxxxxxx"
                   ,(allocator<char> *)&local_13a);
        local_80 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                  ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&msg,&local_80,(char (*) [5])0x135757);
        __l_03._M_len = 1;
        __l_03._M_array = (iterator)&msg;
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_e8,__l_03,(allocator_type *)&local_139);
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_58,&local_78,
                         (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_e8,&local_38);
        goto LAB_0011905a;
      }
      pvVar2 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
               ::unwrap(&token);
      read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                (&local_108,(detail *)pvVar2,
                 (region<std::vector<char,_std::allocator<char>_>_> *)this,loc_00);
      goto LAB_00118f37;
    }
    if (bVar1 == 0x66) {
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
      __s = "\f";
    }
    else if (bVar1 == 0x62) {
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
      __s = "\b";
    }
    else {
      if (bVar1 != 0x5c) goto switchD_00118ca8_caseD_6f;
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)this,1);
      __s = "\\";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,__s,(allocator<char> *)&local_108);
  token._0_8_ = (long)&token.field_1 + 8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p == &msg.field_2) {
    token.field_1.succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)msg.field_2._8_8_;
  }
  else {
    token._0_8_ = msg._M_dataplus._M_p;
  }
  psVar3 = &msg;
  token.field_1.succ.value.super_region_base._vptr_region_base =
       (region_base)(region_base)msg._M_string_length;
  msg._M_string_length = 0;
  msg.field_2._M_allocated_capacity = msg.field_2._M_allocated_capacity & 0xffffffffffffff00;
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::result(__return_storage_ptr__,(success_type *)&token);
  std::__cxx11::string::~string((string *)&token);
LAB_00118eee:
  std::__cxx11::string::~string((string *)psVar3);
  return __return_storage_ptr__;
}

Assistant:

result<std::string, std::string> parse_escape_sequence(location<Container>& loc)
{
    const auto first = loc.iter();
    if(first == loc.end() || *first != '\\')
    {
        return err(format_underline("[error]: toml::parse_escape_sequence: ", {{
            std::addressof(loc), "the next token is not a backslash \"\\\""}}));
    }
    loc.advance();
    switch(*loc.iter())
    {
        case '\\':{loc.advance(); return ok(std::string("\\"));}
        case '"' :{loc.advance(); return ok(std::string("\""));}
        case 'b' :{loc.advance(); return ok(std::string("\b"));}
        case 't' :{loc.advance(); return ok(std::string("\t"));}
        case 'n' :{loc.advance(); return ok(std::string("\n"));}
        case 'f' :{loc.advance(); return ok(std::string("\f"));}
        case 'r' :{loc.advance(); return ok(std::string("\r"));}
        case 'u' :
        {
            if(const auto token = lex_escape_unicode_short::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("[error] parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint uXXXX.",
                           {{std::addressof(loc), "here"}}));
            }
        }
        case 'U':
        {
            if(const auto token = lex_escape_unicode_long::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("[error] parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint Uxxxxxxxx",
                           {{std::addressof(loc), "here"}}));
            }
        }
    }

    const auto msg = format_underline("[error] parse_escape_sequence: "
           "unknown escape sequence appeared.", {{std::addressof(loc),
           "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx"}},
           /* Hints = */{"if you want to write backslash as just one backslash, "
           "use literal string like: regex    = '<\\i\\c*\\s*>'"});
    loc.reset(first);
    return err(msg);
}